

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::HasError(WastParser *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  long lVar4;
  long lVar5;
  
  pEVar2 = (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pEVar1 - (long)pEVar2;
  lVar4 = (lVar5 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar4) {
    lVar5 = lVar4 + 1;
    pEVar3 = pEVar2 + 2;
    do {
      if (pEVar3[-2].error_level == Error) {
        pEVar3 = pEVar3 + -2;
        goto LAB_0013862d;
      }
      if (pEVar3[-1].error_level == Error) {
        pEVar3 = pEVar3 + -1;
        goto LAB_0013862d;
      }
      if (pEVar3->error_level == Error) goto LAB_0013862d;
      if (pEVar3[1].error_level == Error) {
        pEVar3 = pEVar3 + 1;
        goto LAB_0013862d;
      }
      lVar5 = lVar5 + -1;
      pEVar3 = pEVar3 + 4;
    } while (1 < lVar5);
    lVar5 = (long)pEVar1 - (long)(pEVar2 + lVar4 * 4);
    pEVar2 = pEVar2 + lVar4 * 4;
  }
  lVar4 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pEVar3 = pEVar1;
      if ((lVar4 != 3) || (pEVar3 = pEVar2, pEVar2->error_level == Error)) goto LAB_0013862d;
      pEVar2 = pEVar2 + 1;
    }
    pEVar3 = pEVar2;
    if (pEVar2->error_level == Error) goto LAB_0013862d;
    pEVar2 = pEVar2 + 1;
  }
  pEVar3 = pEVar2;
  if (pEVar2->error_level != Error) {
    pEVar3 = pEVar1;
  }
LAB_0013862d:
  return pEVar3 != pEVar1;
}

Assistant:

bool WastParser::HasError() const {
  return std::any_of(errors_->begin(), errors_->end(), [](const auto& x) {
    return x.error_level == ErrorLevel::Error;
  });
}